

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode http_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  HTTP *pHVar2;
  
  pHVar2 = (HTTP *)(*Curl_ccalloc)(1,0x2e8);
  if (pHVar2 == (HTTP *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_mime_initpart(&pHVar2->form,data);
    (data->req).p.http = pHVar2;
    if ((data->state).httpwant == '\x1e') {
      if ((conn->handler->flags & 1) == 0) {
        Curl_failf(data,"HTTP/3 requested for non-HTTPS URL");
        return CURLE_URL_MALFORMAT;
      }
      conn->transport = '\x05';
    }
    else {
      if ((conn->easyq).size == 0) {
        Curl_http2_setup_conn(conn);
      }
      Curl_http2_setup_req(data);
    }
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode http_setup_conn(struct Curl_easy *data,
                                struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  DEBUGASSERT(data->req.p.http == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  Curl_mime_initpart(&http->form, data);
  data->req.p.http = http;

  if(data->state.httpwant == CURL_HTTP_VERSION_3) {
    if(conn->handler->flags & PROTOPT_SSL)
      /* Only go HTTP/3 directly on HTTPS URLs. It needs a UDP socket and does
         the QUIC dance. */
      conn->transport = TRNSPRT_QUIC;
    else {
      failf(data, "HTTP/3 requested for non-HTTPS URL");
      return CURLE_URL_MALFORMAT;
    }
  }
  else {
    if(!CONN_INUSE(conn))
      /* if not already multi-using, setup connection details */
      Curl_http2_setup_conn(conn);
    Curl_http2_setup_req(data);
  }
  return CURLE_OK;
}